

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

void __thiscall embree::Token::Token(Token *this,string *str,Type ty,ParseLocation *loc)

{
  this->ty = ty;
  std::__cxx11::string::string((string *)&this->str,(string *)str);
  ParseLocation::ParseLocation(&this->loc,loc);
  return;
}

Assistant:

Token (std::string str, Type ty, const ParseLocation& loc = ParseLocation()) : ty(ty),   str(str), loc(loc) {}